

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

int yang_read_presence(lys_module *module,lys_node_container *cont,char *value)

{
  char *pcVar1;
  bool bVar2;
  
  bVar2 = cont->presence == (char *)0x0;
  if (bVar2) {
    pcVar1 = lydict_insert_zc(module->ctx,value);
    cont->presence = pcVar1;
  }
  else {
    ly_vlog(module->ctx,LYE_TOOMANY,LY_VLOG_LYS,cont,"presence","container");
    free(value);
  }
  return (uint)!bVar2;
}

Assistant:

int
yang_read_presence(struct lys_module *module, struct lys_node_container *cont, char *value)
{
    if (cont->presence) {
        LOGVAL(module->ctx, LYE_TOOMANY, LY_VLOG_LYS, cont, "presence", "container");
        free(value);
        return EXIT_FAILURE;
    } else {
        cont->presence = lydict_insert_zc(module->ctx, value);
        return EXIT_SUCCESS;
    }
}